

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O1

type jsoncons::decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (char *first,char *last,vector<unsigned_char,_std::allocator<unsigned_char>_> *result
               )

{
  byte *pbVar1;
  pointer *ppuVar2;
  iterator __position;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  ulong in_RAX;
  byte bVar6;
  undefined8 uVar7;
  byte *pbVar8;
  type tVar9;
  undefined8 uStack_38;
  
  uVar7 = 0x18;
  if (((int)last - (int)first & 1U) == 0) {
    pbVar8 = (byte *)first;
    uStack_38 = in_RAX;
    do {
      uVar4 = uStack_38;
      if (pbVar8 == (byte *)last) {
        uVar7 = 0;
        first = last;
        break;
      }
      bVar5 = *pbVar8;
      if ((byte)(bVar5 - 0x30) < 10) {
        bVar5 = bVar5 << 4;
LAB_00260534:
        uStack_38 = uStack_38 & 0xffffffffffffff;
        pbVar1 = pbVar8 + 1;
        pbVar8 = pbVar8 + 2;
        bVar6 = *pbVar1 - 0x30;
        if (9 < bVar6) {
          bVar6 = *pbVar1 | 0x20;
          if (5 < (byte)(bVar6 + 0x9f)) goto LAB_00260573;
          bVar6 = bVar6 + 0xa9;
        }
        uStack_38 = CONCAT17(bVar6 | bVar5,(int7)uVar4);
        __position._M_current =
             (result->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (result->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)result,__position,
                     (uchar *)((long)&uStack_38 + 7));
        }
        else {
          *__position._M_current = bVar6 | bVar5;
          ppuVar2 = &(result->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
        }
        bVar3 = true;
      }
      else {
        if ((byte)((bVar5 | 0x20) + 0x9f) < 6) {
          bVar5 = bVar5 * '\x10' + 0x90;
          goto LAB_00260534;
        }
        pbVar8 = pbVar8 + 1;
LAB_00260573:
        bVar3 = false;
      }
    } while (bVar3);
  }
  tVar9._8_8_ = uVar7;
  tVar9.it = first;
  return tVar9;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base16(InputIt first, InputIt last, Container& result)
    {
        std::size_t len = std::distance(first,last);
        if (len & 1) 
        {
            return decode_result<InputIt>{first, conv_errc::not_base16};
        }

        InputIt it = first;
        while (it != last)
        {
            uint8_t val;
            auto a = *it++;
            if (a >= '0' && a <= '9') 
            {
                val = static_cast<uint8_t>(a - '0') << 4;
            } 
            else if ((a | 0x20) >= 'a' && (a | 0x20) <= 'f') 
            {
                val = (static_cast<uint8_t>((a | 0x20) - 'a') + 10) << 4;
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            auto b = *it++;
            if (b >= '0' && b <= '9') 
            {
                val |= (b - '0');
            } 
            else if ((b | 0x20) >= 'a' && (b | 0x20) <= 'f') 
            {
                val |= ((b | 0x20) - 'a' + 10);
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            result.push_back(val);
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }